

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::IndexStorageInfo>
          (Serializer *this,vector<duckdb::IndexStorageInfo,_true> *vec)

{
  pointer pIVar1;
  long lVar2;
  IndexStorageInfo *item;
  pointer value;
  
  lVar2 = (long)(vec->
                super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
                super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
                super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (*this->_vptr_Serializer[8])(this,lVar2 / 0xa0,lVar2 % 0xa0);
  pIVar1 = (vec->super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
           super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (value = (vec->
               super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
               super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pIVar1; value = value + 1) {
    WriteValue<duckdb::IndexStorageInfo>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}